

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O3

void anon_unknown.dwarf_164365::readWholeFiles(int modification)

{
  float fVar1;
  LineOrder LVar2;
  Compression CVar3;
  size_t sVar4;
  char *fileName;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Header *pHVar12;
  Box2i *pBVar13;
  Box2i *pBVar14;
  float *pfVar15;
  V2f *pVVar16;
  V2f *pVVar17;
  LineOrder *pLVar18;
  Compression *pCVar19;
  ChannelList *this;
  ChannelList *other;
  string *psVar20;
  string *psVar21;
  ulong uVar22;
  uint *puVar23;
  ostream *poVar24;
  undefined4 uVar25;
  uint uVar26;
  undefined8 uVar27;
  int iVar28;
  uint *puVar29;
  long lVar30;
  undefined1 in_R10B;
  ulong uVar31;
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  int iVar38;
  DeepScanLineInputPart part_1;
  Array2D<unsigned_int> sampleCount;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  MultiPartInputFile file;
  Array2D<half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  FrameBuffer frameBuffer;
  Array2D<half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  InputPart part;
  int local_1f4;
  DeepScanLineInputPart local_1e0;
  Array2D<unsigned_int> local_1d8;
  int local_1bc;
  int *local_1b8;
  iterator iStack_1b0;
  int *local_1a8;
  uint *local_1a0;
  MultiPartInputFile local_198;
  Array2D<half_*> local_188;
  Array2D<float_*> local_168;
  Array2D<unsigned_int_*> local_148;
  DeepFrameBuffer local_130;
  Array2D<half> local_c8;
  Array2D<float> local_a8;
  Array2D<unsigned_int> local_88;
  ulong local_70;
  Slice local_68;
  
  fileName = (anonymous_namespace)::filename_abi_cxx11_;
  local_88._sizeX = 0;
  local_88._sizeY = 0;
  local_88._data = (uint *)0x0;
  local_a8._data = (float *)0x0;
  local_a8._sizeX = 0;
  local_a8._sizeY = 0;
  local_c8._data = (half *)0x0;
  local_c8._sizeX = 0;
  local_c8._sizeY = 0;
  local_148._data = (uint **)0x0;
  local_148._sizeX = 0;
  local_148._sizeY = 0;
  local_168._data = (float **)0x0;
  local_168._sizeX = 0;
  local_168._sizeY = 0;
  local_188._data = (half **)0x0;
  local_188._sizeX = 0;
  local_188._sizeY = 0;
  local_1d8._data = (uint *)0x0;
  local_1d8._sizeX = 0;
  local_1d8._sizeY = 0;
  iVar6 = Imf_2_5::globalThreadCount();
  uVar27 = 1;
  Imf_2_5::MultiPartInputFile::MultiPartInputFile(&local_198,fileName,iVar6,true);
  lVar30 = 0;
  lVar32 = 0;
  while( true ) {
    uVar25 = (undefined4)uVar27;
    iVar6 = Imf_2_5::MultiPartInputFile::parts(&local_198);
    if (iVar6 <= lVar32) break;
    pHVar12 = Imf_2_5::MultiPartInputFile::header(&local_198,(int)lVar32);
    pBVar13 = Imf_2_5::Header::displayWindow(pHVar12);
    pBVar14 = Imf_2_5::Header::displayWindow
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar30));
    iVar6 = -(uint)((pBVar14->min).x == (pBVar13->min).x);
    iVar37 = -(uint)((pBVar14->min).y == (pBVar13->min).y);
    auVar33._4_4_ = iVar6;
    auVar33._0_4_ = iVar6;
    auVar33._8_4_ = iVar37;
    auVar33._12_4_ = iVar37;
    iVar6 = movmskpd(uVar25,auVar33);
    if ((iVar6 != 3) ||
       (iVar37 = -(uint)((pBVar14->max).x == (pBVar13->max).x),
       iVar38 = -(uint)((pBVar14->max).y == (pBVar13->max).y), auVar34._4_4_ = iVar37,
       auVar34._0_4_ = iVar37, auVar34._8_4_ = iVar38, auVar34._12_4_ = iVar38,
       iVar37 = movmskpd((int)pBVar14,auVar34), iVar37 != 3)) {
      __assert_fail("header.displayWindow() == headers[i].displayWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f0,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pBVar13 = Imf_2_5::Header::dataWindow(pHVar12);
    pBVar14 = Imf_2_5::Header::dataWindow
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar30));
    iVar37 = -(uint)((pBVar14->min).x == (pBVar13->min).x);
    iVar38 = -(uint)((pBVar14->min).y == (pBVar13->min).y);
    auVar35._4_4_ = iVar37;
    auVar35._0_4_ = iVar37;
    auVar35._8_4_ = iVar38;
    auVar35._12_4_ = iVar38;
    uVar26 = movmskpd(iVar6,auVar35);
    uVar22 = (ulong)uVar26;
    if ((uVar26 != 3) ||
       (iVar6 = -(uint)((pBVar14->max).x == (pBVar13->max).x),
       iVar37 = -(uint)((pBVar14->max).y == (pBVar13->max).y), auVar36._4_4_ = iVar6,
       auVar36._0_4_ = iVar6, auVar36._8_4_ = iVar37, auVar36._12_4_ = iVar37,
       iVar6 = movmskpd((int)pBVar14,auVar36), iVar6 != 3)) {
      __assert_fail("header.dataWindow() == headers[i].dataWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f1,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar15 = Imf_2_5::Header::pixelAspectRatio(pHVar12);
    fVar1 = *pfVar15;
    pfVar15 = Imf_2_5::Header::pixelAspectRatio
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar30));
    if ((fVar1 != *pfVar15) || (NAN(fVar1) || NAN(*pfVar15))) {
      __assert_fail("header.pixelAspectRatio() == headers[i].pixelAspectRatio()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f2,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pVVar16 = Imf_2_5::Header::screenWindowCenter(pHVar12);
    pVVar17 = Imf_2_5::Header::screenWindowCenter
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar30));
    if ((((pVVar16->x != pVVar17->x) || (NAN(pVVar16->x) || NAN(pVVar17->x))) ||
        (pVVar16->y != pVVar17->y)) || (NAN(pVVar16->y) || NAN(pVVar17->y))) {
      __assert_fail("header.screenWindowCenter() == headers[i].screenWindowCenter()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f3,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar15 = Imf_2_5::Header::screenWindowWidth(pHVar12);
    fVar1 = *pfVar15;
    pfVar15 = Imf_2_5::Header::screenWindowWidth
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar30));
    if ((fVar1 != *pfVar15) || (NAN(fVar1) || NAN(*pfVar15))) {
      __assert_fail("header.screenWindowWidth() == headers[i].screenWindowWidth()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f4,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pLVar18 = Imf_2_5::Header::lineOrder(pHVar12);
    LVar2 = *pLVar18;
    pLVar18 = Imf_2_5::Header::lineOrder
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar30));
    if (LVar2 != *pLVar18) {
      __assert_fail("header.lineOrder() == headers[i].lineOrder()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f5,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pCVar19 = Imf_2_5::Header::compression(pHVar12);
    CVar3 = *pCVar19;
    pCVar19 = Imf_2_5::Header::compression
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar30));
    if (CVar3 != *pCVar19) {
      __assert_fail("header.compression() == headers[i].compression()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f6,"void (anonymous namespace)::readWholeFiles(int)");
    }
    this = Imf_2_5::Header::channels(pHVar12);
    other = Imf_2_5::Header::channels
                      ((Header *)
                       (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar30));
    bVar5 = Imf_2_5::ChannelList::operator==(this,other);
    if (!bVar5) {
      __assert_fail("header.channels() == headers[i].channels()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f7,"void (anonymous namespace)::readWholeFiles(int)");
    }
    psVar20 = Imf_2_5::Header::name_abi_cxx11_(pHVar12);
    psVar21 = Imf_2_5::Header::name_abi_cxx11_
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar30));
    sVar4 = psVar20->_M_string_length;
    if ((sVar4 != psVar21->_M_string_length) ||
       ((sVar4 != 0 &&
        (iVar6 = bcmp((psVar20->_M_dataplus)._M_p,(psVar21->_M_dataplus)._M_p,sVar4), iVar6 != 0))))
    {
      __assert_fail("header.name() == headers[i].name()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f8,"void (anonymous namespace)::readWholeFiles(int)");
    }
    uVar27 = CONCAT71((int7)(uVar22 >> 8),lVar32 == 0 && modification == 1);
    if (lVar32 == 0 && modification == 1) {
      psVar20 = Imf_2_5::Header::type_abi_cxx11_(pHVar12);
      psVar21 = Imf_2_5::Header::type_abi_cxx11_((anonymous_namespace)::headers);
      sVar4 = psVar20->_M_string_length;
      if ((sVar4 == psVar21->_M_string_length) &&
         ((sVar4 == 0 ||
          (iVar6 = bcmp((psVar20->_M_dataplus)._M_p,(psVar21->_M_dataplus)._M_p,sVar4), iVar6 == 0))
         )) {
        __assert_fail("header.type() != headers[i].type()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                      ,0x2fb,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    else {
      psVar20 = Imf_2_5::Header::type_abi_cxx11_(pHVar12);
      psVar21 = Imf_2_5::Header::type_abi_cxx11_
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar30)
                          );
      sVar4 = psVar20->_M_string_length;
      if ((sVar4 != psVar21->_M_string_length) ||
         ((sVar4 != 0 &&
          (iVar6 = bcmp((psVar20->_M_dataplus)._M_p,(psVar21->_M_dataplus)._M_p,sVar4), iVar6 != 0))
         )) {
        __assert_fail("header.type() == headers[i].type()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                      ,0x2fd,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    lVar32 = lVar32 + 1;
    lVar30 = lVar30 + 0x38;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading whole files ",0x14);
  std::ostream::flush();
  local_1b8 = (int *)0x0;
  iStack_1b0._M_current = (int *)0x0;
  local_1a8 = (int *)0x0;
  local_130._map._M_t._M_impl._0_4_ = ZEXT14(0 < modification);
  if ((int)((ulong)(DAT_004a2778 - (long)(anonymous_namespace)::headers) >> 3) * -0x49249249 <=
      (int)local_130._map._M_t._M_impl._0_4_) {
    Imf_2_5::MultiPartInputFile::~MultiPartInputFile(&local_198);
    goto LAB_00163b3c;
  }
  lVar30 = DAT_004a2778;
  pHVar12 = (anonymous_namespace)::headers;
  do {
    if (iStack_1b0._M_current == local_1a8) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_1b8,iStack_1b0,(int *)&local_130);
      lVar30 = DAT_004a2778;
      pHVar12 = (anonymous_namespace)::headers;
    }
    else {
      *iStack_1b0._M_current = local_130._map._M_t._M_impl._0_4_;
      iStack_1b0._M_current = iStack_1b0._M_current + 1;
    }
    local_130._map._M_t._M_impl._0_4_ = local_130._map._M_t._M_impl._0_4_ + 1;
  } while ((int)local_130._map._M_t._M_impl._0_4_ <
           (int)((ulong)(lVar30 - (long)pHVar12) >> 3) * -0x49249249);
  if ((long)iStack_1b0._M_current - (long)local_1b8 == 0) {
    puVar29 = (uint *)0x0;
LAB_00163b0b:
    if (local_1b8 != (int *)0x0) goto LAB_00163b10;
  }
  else {
    uVar22 = (long)iStack_1b0._M_current - (long)local_1b8 >> 2;
    uVar31 = 0;
    do {
      iVar37 = random_int((int)uVar22);
      iVar38 = random_int((int)((ulong)((long)iStack_1b0._M_current - (long)local_1b8) >> 2));
      iVar6 = local_1b8[iVar37];
      local_1b8[iVar37] = local_1b8[iVar38];
      local_1b8[iVar38] = iVar6;
      uVar31 = uVar31 + 1;
      uVar22 = (long)iStack_1b0._M_current - (long)local_1b8 >> 2;
    } while (uVar31 < uVar22);
    if (iStack_1b0._M_current != local_1b8) {
      puVar29 = (uint *)0x0;
      uVar22 = 0;
      do {
        iVar6 = local_1b8[uVar22];
        lVar30 = (long)iVar6;
        local_70 = uVar22;
        switch(*(undefined4 *)((anonymous_namespace)::partTypes + lVar30 * 4)) {
        case 0:
          local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
          local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          setInputFrameBuffer((FrameBuffer *)&local_130,
                              *(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4),&local_88,
                              &local_a8,&local_c8,0x10,0x10);
          Imf_2_5::InputPart::InputPart((InputPart *)&local_68,&local_198,iVar6);
          Imf_2_5::InputPart::setFrameBuffer((InputPart *)&local_68,(FrameBuffer *)&local_130);
          Imf_2_5::InputPart::readPixels((InputPart *)&local_68,0,0xf);
          iVar37 = *(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4);
          if (iVar37 == 0) {
            bVar5 = checkPixels<unsigned_int>(&local_88,0,0xf,0,0xf,0x10);
            if (!bVar5) {
              __assert_fail("checkPixels<unsigned int>(uData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x32c,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar37 == 1) {
            bVar5 = checkPixels<float>(&local_a8,0,0xf,0,0xf,0x10);
            if (!bVar5) {
              __assert_fail("checkPixels<float>(fData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x32f,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar37 == 2) && (bVar5 = checkPixels<half>(&local_c8,0,0xf,0,0xf,0x10), !bVar5))
          {
            __assert_fail("checkPixels<half>(hData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                          ,0x332,"void (anonymous namespace)::readWholeFiles(int)");
          }
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)&local_130);
          break;
        case 1:
          Imf_2_5::TiledInputPart::TiledInputPart((TiledInputPart *)&local_68,&local_198,iVar6);
          iVar37 = Imf_2_5::TiledInputPart::numXLevels((TiledInputPart *)&local_68);
          local_1a0 = puVar29;
          iVar38 = Imf_2_5::TiledInputPart::numYLevels((TiledInputPart *)&local_68);
          puVar29 = local_1a0;
          if (0 < iVar37) {
            iVar7 = 0;
            do {
              if (0 < iVar38) {
                iVar8 = 0;
                do {
                  bVar5 = Imf_2_5::TiledInputPart::isValidLevel
                                    ((TiledInputPart *)&local_68,iVar7,iVar8);
                  if (bVar5) {
                    iVar10 = Imf_2_5::TiledInputPart::levelWidth((TiledInputPart *)&local_68,iVar7);
                    iVar28 = Imf_2_5::TiledInputPart::levelHeight((TiledInputPart *)&local_68,iVar8)
                    ;
                    local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                    local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)0x0;
                    local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
                    local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                    local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                         local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    setInputFrameBuffer((FrameBuffer *)&local_130,
                                        *(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4),
                                        &local_88,&local_a8,&local_c8,iVar10,iVar28);
                    Imf_2_5::TiledInputPart::setFrameBuffer
                              ((TiledInputPart *)&local_68,(FrameBuffer *)&local_130);
                    iVar9 = Imf_2_5::TiledInputPart::numXTiles((TiledInputPart *)&local_68,iVar7);
                    iVar11 = Imf_2_5::TiledInputPart::numYTiles((TiledInputPart *)&local_68,iVar8);
                    Imf_2_5::TiledInputPart::readTiles
                              ((TiledInputPart *)&local_68,0,iVar9 + -1,0,iVar11 + -1,iVar7,iVar8);
                    iVar9 = *(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4);
                    if (iVar9 == 0) {
                      bVar5 = checkPixels<unsigned_int>
                                        (&local_88,0,iVar10 + -1,0,iVar28 + -1,iVar10);
                      if (!bVar5) {
                        __assert_fail("checkPixels<unsigned int>(uData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                      ,0x350,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                    }
                    else if (iVar9 == 1) {
                      bVar5 = checkPixels<float>(&local_a8,0,iVar10 + -1,0,iVar28 + -1,iVar10);
                      if (!bVar5) {
                        __assert_fail("checkPixels<float>(fData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                      ,0x353,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                    }
                    else if ((iVar9 == 2) &&
                            (bVar5 = checkPixels<half>(&local_c8,0,iVar10 + -1,0,iVar28 + -1,iVar10)
                            , !bVar5)) {
                      __assert_fail("checkPixels<half>(hData, w, h)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                    ,0x356,"void (anonymous namespace)::readWholeFiles(int)");
                    }
                    std::
                    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                                 *)&local_130);
                  }
                  iVar8 = iVar8 + 1;
                } while (iVar38 != iVar8);
              }
              iVar7 = iVar7 + 1;
              puVar29 = local_1a0;
            } while (iVar7 != iVar37);
          }
          break;
        case 2:
          Imf_2_5::DeepScanLineInputPart::DeepScanLineInputPart(&local_1e0,&local_198,iVar6);
          local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
          local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_2_5::Slice::Slice
                    (&local_130._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
                     SUB81(local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
          puVar23 = (uint *)operator_new__(0x400);
          if (puVar29 != (uint *)0x0) {
            operator_delete__(puVar29);
          }
          local_1d8._sizeX = 0x10;
          local_1d8._sizeY = 0x10;
          local_1d8._data = puVar23;
          Imf_2_5::Slice::Slice(&local_68,UINT,(char *)puVar23,4,0x40,1,1,0.0,(bool)in_R10B,false);
          Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&local_130,&local_68);
          setInputDeepFrameBuffer
                    (&local_130,*(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4),&local_148,
                     &local_168,&local_188,0x10,0x10);
          Imf_2_5::DeepScanLineInputPart::setFrameBuffer(&local_1e0,&local_130);
          Imf_2_5::DeepScanLineInputPart::readPixelSampleCounts(&local_1e0,0,0xf);
          allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4),&local_1d8,
                         &local_148,&local_168,&local_188,0,0xf,0,0xf);
          Imf_2_5::DeepScanLineInputPart::readPixels(&local_1e0,0,0xf);
          iVar37 = *(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4);
          if (iVar37 == 0) {
            bVar5 = checkPixels<unsigned_int>(&local_1d8,&local_148,0,0xf,0,0xf,0x10);
            if (!bVar5) {
              __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x376,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar37 == 1) {
            bVar5 = checkPixels<float>(&local_1d8,&local_168,0,0xf,0,0xf,0x10);
            if (!bVar5) {
              __assert_fail("checkPixels<float>(sampleCount, deepFData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x379,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar37 == 2) &&
                  (bVar5 = checkPixels<half>(&local_1d8,&local_188,0,0xf,0,0xf,0x10), !bVar5)) {
            __assert_fail("checkPixels<half>(sampleCount, deepHData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                          ,0x37c,"void (anonymous namespace)::readWholeFiles(int)");
          }
          releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4),&local_148,
                        &local_168,&local_188,0,0xf,0,0xf);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                       *)&local_130);
          puVar29 = puVar23;
          break;
        case 3:
          Imf_2_5::DeepTiledInputPart::DeepTiledInputPart
                    ((DeepTiledInputPart *)&local_1e0,&local_198,iVar6);
          local_1bc = Imf_2_5::DeepTiledInputPart::numXLevels((DeepTiledInputPart *)&local_1e0);
          iVar37 = Imf_2_5::DeepTiledInputPart::numYLevels((DeepTiledInputPart *)&local_1e0);
          if (0 < local_1bc) {
            local_1f4 = 0;
            do {
              puVar23 = puVar29;
              if (0 < iVar37) {
                iVar38 = 0;
                do {
                  bVar5 = Imf_2_5::DeepTiledInputPart::isValidLevel
                                    ((DeepTiledInputPart *)&local_1e0,local_1f4,iVar38);
                  if (bVar5) {
                    iVar7 = Imf_2_5::DeepTiledInputPart::levelWidth
                                      ((DeepTiledInputPart *)&local_1e0,local_1f4);
                    iVar8 = Imf_2_5::DeepTiledInputPart::levelHeight
                                      ((DeepTiledInputPart *)&local_1e0,iVar38);
                    local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                    local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)0x0;
                    local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
                    local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                    local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                         local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    Imf_2_5::Slice::Slice
                              (&local_130._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
                               SUB81(local_130._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_left,0));
                    lVar32 = (long)iVar7;
                    uVar22 = iVar8 * lVar32;
                    local_1a0 = (uint *)operator_new__(-(ulong)(uVar22 >> 0x3e != 0) | uVar22 * 4);
                    if (puVar29 != (uint *)0x0) {
                      operator_delete__(puVar29);
                    }
                    local_1d8._data = local_1a0;
                    local_1d8._sizeX = (long)iVar8;
                    local_1d8._sizeY = lVar32;
                    Imf_2_5::Slice::Slice
                              (&local_68,UINT,(char *)local_1a0,4,lVar32 << 2,1,1,0.0,(bool)in_R10B,
                               false);
                    Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&local_130,&local_68);
                    setInputDeepFrameBuffer
                              (&local_130,*(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4),
                               &local_148,&local_168,&local_188,iVar7,iVar8);
                    Imf_2_5::DeepTiledInputPart::setFrameBuffer
                              ((DeepTiledInputPart *)&local_1e0,&local_130);
                    iVar9 = Imf_2_5::DeepTiledInputPart::numXTiles
                                      ((DeepTiledInputPart *)&local_1e0,local_1f4);
                    iVar10 = Imf_2_5::DeepTiledInputPart::numYTiles
                                       ((DeepTiledInputPart *)&local_1e0,iVar38);
                    Imf_2_5::DeepTiledInputPart::readPixelSampleCounts
                              ((DeepTiledInputPart *)&local_1e0,0,iVar9 + -1,0,iVar10 + -1,local_1f4
                               ,iVar38);
                    iVar28 = iVar7 + -1;
                    iVar8 = iVar8 + -1;
                    allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4),
                                   &local_1d8,&local_148,&local_168,&local_188,0,iVar28,0,iVar8);
                    Imf_2_5::DeepTiledInputPart::readTiles
                              ((DeepTiledInputPart *)&local_1e0,0,iVar9 + -1,0,iVar10 + -1,local_1f4
                               ,iVar38);
                    iVar9 = *(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4);
                    if (iVar9 == 0) {
                      bVar5 = checkPixels<unsigned_int>
                                        (&local_1d8,&local_148,0,iVar28,0,iVar8,iVar7);
                      if (!bVar5) {
                        __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                      ,0x3ad,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                    }
                    else if (iVar9 == 1) {
                      bVar5 = checkPixels<float>(&local_1d8,&local_168,0,iVar28,0,iVar8,iVar7);
                      if (!bVar5) {
                        __assert_fail("checkPixels<float>(sampleCount, deepFData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                      ,0x3b0,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                    }
                    else if ((iVar9 == 2) &&
                            (bVar5 = checkPixels<half>(&local_1d8,&local_188,0,iVar28,0,iVar8,iVar7)
                            , !bVar5)) {
                      __assert_fail("checkPixels<half>(sampleCount, deepHData, w, h)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                    ,0x3b3,"void (anonymous namespace)::readWholeFiles(int)");
                    }
                    releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar30 * 4),
                                  &local_148,&local_168,&local_188,0,iVar28,0,iVar8);
                    std::
                    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                                 *)&local_130);
                    puVar29 = local_1a0;
                    puVar23 = local_1a0;
                  }
                  iVar38 = iVar38 + 1;
                } while (iVar37 != iVar38);
              }
              local_1f4 = local_1f4 + 1;
              puVar29 = puVar23;
            } while (local_1f4 != local_1bc);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"part ",5);
        poVar24 = (ostream *)std::ostream::operator<<(&std::cerr,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar24," ok ",4);
        uVar22 = local_70 + 1;
      } while (uVar22 < (ulong)((long)iStack_1b0._M_current - (long)local_1b8 >> 2));
      goto LAB_00163b0b;
    }
LAB_00163b10:
    operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
    puVar29 = local_1d8._data;
  }
  Imf_2_5::MultiPartInputFile::~MultiPartInputFile(&local_198);
  if (puVar29 != (uint *)0x0) {
    operator_delete__(puVar29);
  }
LAB_00163b3c:
  if (local_188._data != (half **)0x0) {
    operator_delete__(local_188._data);
  }
  if (local_168._data != (float **)0x0) {
    operator_delete__(local_168._data);
  }
  if (local_148._data != (uint **)0x0) {
    operator_delete__(local_148._data);
  }
  if (local_c8._data != (half *)0x0) {
    operator_delete__(local_c8._data);
  }
  if (local_a8._data != (float *)0x0) {
    operator_delete__(local_a8._data);
  }
  if (local_88._data != (uint *)0x0) {
    operator_delete__(local_88._data);
  }
  return;
}

Assistant:

void
readWholeFiles (int modification)
{
    Array2D<unsigned int> uData;
    Array2D<float> fData;
    Array2D<half> hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*> deepFData;
    Array2D<half*> deepHData;

    Array2D<unsigned int> sampleCount;

    MultiPartInputFile file(filename.c_str());
    for (int i = 0; i < file.parts(); i++)
    {
        const Header& header = file.header(i);
        assert (header.displayWindow() == headers[i].displayWindow());
        assert (header.dataWindow() == headers[i].dataWindow());
        assert (header.pixelAspectRatio() == headers[i].pixelAspectRatio());
        assert (header.screenWindowCenter() == headers[i].screenWindowCenter());
        assert (header.screenWindowWidth() == headers[i].screenWindowWidth());
        assert (header.lineOrder() == headers[i].lineOrder());
        assert (header.compression() == headers[i].compression());
        assert (header.channels() == headers[i].channels());
        assert (header.name() == headers[i].name());
        if(modification==1 && i==0)
        {
            assert (header.type() != headers[i].type());
        }else{
            assert (header.type() == headers[i].type());
        }
    }

    cout << "Reading whole files " << flush;

    
    
    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    for (int i = modification>0 ? 1 : 0; i < static_cast<int>(headers.size()); i++)
        shuffledPartNumber.push_back(i);
    for (size_t i = 0; i < shuffledPartNumber.size(); i++)
    {
        size_t a = random_int(shuffledPartNumber.size());
        size_t b = random_int(shuffledPartNumber.size());
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }


   

    //
    // Start reading whole files.
    //
    int partNumber;
    try
    {
        for (size_t i = 0; i < shuffledPartNumber.size(); i++)
        {
            partNumber = shuffledPartNumber[i];
            switch (partTypes[partNumber])
            {
                case 0:
                {
                    FrameBuffer frameBuffer;
                    setInputFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                        uData, fData, hData, width, height);

                    InputPart part(file, partNumber);
                    part.setFrameBuffer(frameBuffer);
                    part.readPixels(0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert(checkPixels<unsigned int>(uData, width, height));
                            break;
                        case 1:
                            assert(checkPixels<float>(fData, width, height));
                            break;
                        case 2:
                            assert(checkPixels<half>(hData, width, height));
                            break;
                    }
                    break;
                }
                case 1:
                {
                    TiledInputPart part(file, partNumber);
                    int numXLevels = part.numXLevels();
                    int numYLevels = part.numYLevels();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel(xLevel, yLevel))
                                continue;

                            int w = part.levelWidth(xLevel);
                            int h = part.levelHeight(yLevel);

                            FrameBuffer frameBuffer;
                            setInputFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                                uData, fData, hData, w, h);

                            part.setFrameBuffer(frameBuffer);
                            int numXTiles = part.numXTiles(xLevel);
                            int numYTiles = part.numYTiles(yLevel);
                            part.readTiles(0, numXTiles - 1, 0, numYTiles - 1, xLevel, yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert(checkPixels<unsigned int>(uData, w, h));
                                    break;
                                case 1:
                                    assert(checkPixels<float>(fData, w, h));
                                    break;
                                case 2:
                                    assert(checkPixels<half>(hData, w, h));
                                    break;
                            }
                        }
                    break;
                }
                case 2:
                {
                    DeepScanLineInputPart part(file, partNumber);

                    DeepFrameBuffer frameBuffer;

                    sampleCount.resizeErase(height, width);
                    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                                        (char *) (&sampleCount[0][0]),
                                                        sizeof (unsigned int) * 1,
                                                        sizeof (unsigned int) * width));

                    setInputDeepFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                            deepUData, deepFData, deepHData, width, height);

                    part.setFrameBuffer(frameBuffer);

                    part.readPixelSampleCounts(0, height - 1);

                    allocatePixels(pixelTypes[partNumber], sampleCount,
                                   deepUData, deepFData, deepHData, width, height);

                    part.readPixels(0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert(checkPixels<unsigned int>(sampleCount, deepUData, width, height));
                            break;
                        case 1:
                            assert(checkPixels<float>(sampleCount, deepFData, width, height));
                            break;
                        case 2:
                            assert(checkPixels<half>(sampleCount, deepHData, width, height));
                            break;
                    }

                    releasePixels(pixelTypes[partNumber],
                                  deepUData, deepFData, deepHData, width, height);

                    break;
                }
                case 3:
                {
                    DeepTiledInputPart part(file, partNumber);
                    int numXLevels = part.numXLevels();
                    int numYLevels = part.numYLevels();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel(xLevel, yLevel))
                                continue;

                            int w = part.levelWidth(xLevel);
                            int h = part.levelHeight(yLevel);

                            DeepFrameBuffer frameBuffer;

                            sampleCount.resizeErase(h, w);
                            frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                                                (char *) (&sampleCount[0][0]),
                                                                sizeof (unsigned int) * 1,
                                                                sizeof (unsigned int) * w));

                            setInputDeepFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                                    deepUData, deepFData, deepHData, w, h);

                            part.setFrameBuffer(frameBuffer);

                            int numXTiles = part.numXTiles(xLevel);
                            int numYTiles = part.numYTiles(yLevel);

                            part.readPixelSampleCounts(0, numXTiles - 1, 0, numYTiles - 1,
                                                       xLevel, yLevel);

                            allocatePixels(pixelTypes[partNumber], sampleCount,
                                           deepUData, deepFData, deepHData, w, h);

                            part.readTiles(0, numXTiles - 1, 0, numYTiles - 1, xLevel, yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert(checkPixels<unsigned int>(sampleCount, deepUData, w, h));
                                    break;
                                case 1:
                                    assert(checkPixels<float>(sampleCount, deepFData, w, h));
                                    break;
                                case 2:
                                    assert(checkPixels<half>(sampleCount, deepHData, w, h));
                                    break;
                            }

                            releasePixels(pixelTypes[partNumber],
                                          deepUData, deepFData, deepHData, w, h);
                        }

                    break;
                }
            }
            cerr << "part " << partNumber << " ok ";
            
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}